

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_std_string_utf.cpp
# Opt level: O1

string * ON_UTF32_to_std_string_abi_cxx11_
                   (string *__return_storage_ptr__,int bTestByteOrder,ON__UINT32 *sUTF32,
                   int sUTF32_count,uint *error_status,uint error_mask,ON__UINT32 error_code_point,
                   ON__UINT32 **sNextUTF32)

{
  ON__UINT32 OVar1;
  bool bVar2;
  uint uVar3;
  ON__UINT32 *pOVar4;
  uint uVar5;
  undefined4 in_register_0000008c;
  uint uVar6;
  uint es;
  string *local_250;
  ON__UINT32 *sNextIn;
  undefined8 local_240;
  char buffer [512];
  
  local_240 = CONCAT44(in_register_0000008c,error_mask);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (sUTF32 != (ON__UINT32 *)0x0 && sUTF32_count == -1) {
    sUTF32_count = -1;
    pOVar4 = sUTF32;
    do {
      sUTF32_count = sUTF32_count + 1;
      OVar1 = *pOVar4;
      pOVar4 = pOVar4 + 1;
    } while (OVar1 != 0);
  }
  buffer[0x1ff] = '\0';
  local_250 = __return_storage_ptr__;
  if (error_status != (uint *)0x0) {
    *error_status = 0;
  }
  do {
    es = 0;
    sNextIn = (ON__UINT32 *)0x0;
    uVar3 = ON_ConvertUTF32ToUTF8
                      (bTestByteOrder,sUTF32,sUTF32_count,buffer,0x1ff,&es,(uint)local_240,
                       error_code_point,&sNextIn);
    uVar6 = (uint)((ulong)((long)sNextIn - (long)sUTF32) >> 2);
    if (sNextIn <= sUTF32) {
      uVar6 = 0;
    }
    uVar5 = 0;
    if (uVar3 < 0x200) {
      uVar5 = uVar3;
    }
    buffer[(int)uVar5] = '\0';
    if (sUTF32 == (ON__UINT32 *)0x0) {
      uVar6 = 0;
    }
    if (0x1fe < uVar3 - 1) {
      uVar3 = 0;
    }
    if ((int)uVar6 < 1) {
      uVar3 = 0;
    }
    if ((int)uVar3 >= 1) {
      std::__cxx11::string::append((char *)local_250,(ulong)buffer);
      if ((0 < (int)uVar6) && ((es & 2) != 0)) {
        es = es & 0xfffffffd;
      }
    }
    if (error_status != (uint *)0x0) {
      *error_status = *error_status | es;
    }
    sUTF32_count = sUTF32_count - uVar6;
    if ((((int)uVar3 < 1 || (int)uVar6 < 1) || sUTF32_count < 1) || ((es & 3) != 0)) {
      bVar2 = false;
    }
    else {
      bVar2 = true;
      bTestByteOrder = 0;
    }
    sUTF32 = sUTF32 + (int)uVar6;
  } while (bVar2);
  if (sNextUTF32 != (ON__UINT32 **)0x0) {
    *sNextUTF32 = sUTF32;
  }
  return local_250;
}

Assistant:

std::string ON_UTF32_to_std_string(
  int bTestByteOrder,
  const ON__UINT32* sUTF32,
  int sUTF32_count,
  unsigned int* error_status,
  unsigned int error_mask,
  ON__UINT32 error_code_point,
  const ON__UINT32** sNextUTF32
  ) ON_NOEXCEPT
{
  std::string str;
  char buffer[512];
  const int buffer_count = static_cast<int>(sizeof(buffer)/sizeof(buffer[0]));
  unsigned int es;
  const ON__UINT32* sNextIn;

  if ( -1 == sUTF32_count && 0 != sUTF32 )
  {
    for ( sUTF32_count = 0; 0 != sUTF32[sUTF32_count]; sUTF32_count++)
    {
      // empty for body
    }
  }

  buffer[buffer_count-1] = 0;

  if ( 0 != error_status )
    *error_status = 0;

  for(;;)
  {
    es = 0;
    sNextIn = 0;
    int rc = ON_ConvertUTF32ToUTF8(
      bTestByteOrder, sUTF32, sUTF32_count,
      buffer, buffer_count-1,
      &es, error_mask, error_code_point,
      &sNextIn
      );

    // insure buffer[] is null terminated.
    buffer[( rc >= 0 && rc < buffer_count) ? rc : 0] = 0;

    // in_count = number of input sUTF32[] elements that were processed
    int in_count = ( 0 != sNextIn && 0 != sUTF32 && sNextIn > sUTF32 )
      ? static_cast<int>(sNextIn - sUTF32)
      : 0;

    // out_count = number of UTF-8 output values
    int out_count = ( in_count > 0 && rc > 0 && rc < buffer_count) ? rc : 0;

    if ( out_count > 0 )
    {
      try {
        str.append(buffer,out_count);
      } catch (const std::exception& ) {
        es |= 2;
        in_count = 0;
        out_count = 0;
      }
    }

    sUTF32 += in_count;
    sUTF32_count -= in_count;

    if ( 0 != (0x02 & es) && in_count > 0 && out_count > 0 )
    {
      // buffer[] was not long enough and we made progress.
      // Clear bit 2 and allow further processing
      es &= 0xFFFFFFFD;
    }

    if ( 0 != error_status )
      *error_status |= es;

    if ( sUTF32_count > 0 && in_count > 0 && out_count > 0 && 0 == (es & 3) )
    {
      // There were no blocking errors, we made progress, and there is more input
      bTestByteOrder = false;
      continue;
    }

    break; // finished
  }

  if ( sNextUTF32 )
    *sNextUTF32 = sUTF32;

  // On modern compilers, this return will use an efficient rvalue reference.
  return str;
}